

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linkedlist_add_front.c
# Opt level: O2

int test_linkedlist_add_front(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  s_linkedlist *linked_list;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  
  linked_list = linkedlist_create();
  pcVar6 = strdup("apple");
  linkedlist_add_front(linked_list,pcVar6);
  pcVar6 = strdup("banana");
  linkedlist_add_front(linked_list,pcVar6);
  pcVar6 = strdup("clementine");
  linkedlist_add_front(linked_list,pcVar6);
  pcVar6 = strdup("damson plum");
  linkedlist_add_front(linked_list,pcVar6);
  pcVar6 = strdup("elderberry");
  linkedlist_add_front(linked_list,pcVar6);
  pcVar6 = strdup("fig");
  linkedlist_add_front(linked_list,pcVar6);
  bVar8 = linked_list->size != 6;
  pcVar6 = (char *)linkedlist_get(linked_list,5);
  iVar1 = strcmp_with_s2_nullcheck("apple",pcVar6);
  uVar7 = bVar8 + 1;
  if (iVar1 == 0) {
    uVar7 = (uint)bVar8;
  }
  pcVar6 = (char *)linkedlist_get(linked_list,4);
  iVar1 = strcmp_with_s2_nullcheck("banana",pcVar6);
  pcVar6 = (char *)linkedlist_get(linked_list,3);
  iVar2 = strcmp_with_s2_nullcheck("clementine",pcVar6);
  pcVar6 = (char *)linkedlist_get(linked_list,2);
  iVar3 = strcmp_with_s2_nullcheck("damson plum",pcVar6);
  pcVar6 = (char *)linkedlist_get(linked_list,1);
  iVar4 = strcmp_with_s2_nullcheck("elderberry",pcVar6);
  pcVar6 = (char *)linkedlist_get(linked_list,0);
  iVar5 = strcmp_with_s2_nullcheck("fig",pcVar6);
  linkedlist_destroy(linked_list,fun_free_memory);
  return (int)(iVar5 == 0 &&
              (((uVar7 - (iVar1 == 0)) - (uint)(iVar2 == 0)) - (uint)(iVar3 == 0)) + 4 ==
              (uint)(iVar4 == 0));
}

Assistant:

int test_linkedlist_add_front(void) {
    s_linkedlist *linked_list = NULL;
    unsigned int error        = 0;

    // Test
    linked_list = linkedlist_create();
    linkedlist_add_front(linked_list, strdup("apple"));
    linkedlist_add_front(linked_list, strdup("banana"));
    linkedlist_add_front(linked_list, strdup("clementine"));
    linkedlist_add_front(linked_list, strdup("damson plum"));
    linkedlist_add_front(linked_list, strdup("elderberry"));
    linkedlist_add_front(linked_list, strdup("fig"));

    // Assert
    if (linked_list->size != 6) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("apple", linkedlist_get(linked_list, 5)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("banana", linkedlist_get(linked_list, 4)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("clementine", linkedlist_get(linked_list, 3)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("damson plum", linkedlist_get(linked_list, 2)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("elderberry", linkedlist_get(linked_list, 1)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("fig", linkedlist_get(linked_list, 0)) != 0) {
        error += 1;
    }

    // Free allocated memory
    linkedlist_destroy(linked_list, &fun_free_memory);

    return (error == 0);
}